

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O2

void __thiscall OpenGliderConnection::APRSMain(OpenGliderConnection *this)

{
  SOCKET *__pipedes;
  double dVar1;
  bool bVar2;
  uint __i;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  NetRuntimeError *pNVar6;
  long lVar7;
  long lVar8;
  size_t __n;
  fd_set *pfVar9;
  char *buffer;
  string *psVar10;
  positionTy *ppVar11;
  int __flags;
  int iVar12;
  byte bVar13;
  allocator<char> local_179;
  TCPConnection *local_178;
  float *local_170;
  positionTy *local_168;
  ThreadSettings TS;
  string local_150 [2];
  fd_set sRead;
  timeval timeout;
  positionTy currPos;
  timeval *__timeout;
  
  bVar13 = 0;
  ThreadSettings::ThreadSettings(&TS,"LT_OGN_APRS",0x1fbf,"C");
  (this->aprsData)._M_string_length = 0;
  *(this->aprsData)._M_dataplus._M_p = '\0';
  this->aprsLastData = NAN;
  this->aprsLastKeepAlive = 0.0;
  local_178 = &this->tcpAprs;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sRead,"aprs.glidernet.org",(allocator<char> *)&currPos);
  XPMP2::SocketNetworking::Connect
            (&(this->tcpAprs).super_SocketNetworking,(string *)&sRead,0x38f4,0x1000,60000);
  std::__cxx11::string::~string((string *)&sRead);
  iVar12 = (this->tcpAprs).super_SocketNetworking.f_socket;
  __pipedes = this->aprsPipe;
  iVar3 = pipe(__pipedes);
  if (iVar3 < 0) {
    pNVar6 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sRead,"Couldn\'t create pipe",(allocator<char> *)&currPos);
    XPMP2::NetRuntimeError::NetRuntimeError(pNVar6,(string *)&sRead);
    __cxa_throw(pNVar6,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError);
  }
  fcntl(*__pipedes,4,0x800);
  iVar4 = dataRefs.fdStdDistance;
  iVar12 = iVar12 + 1;
  iVar3 = *__pipedes + 1;
  if (*__pipedes + 1 < iVar12) {
    iVar3 = iVar12;
  }
  DataRefs::GetViewPos();
  local_168 = &this->aprsPos;
  lVar8 = 9;
  pfVar9 = &sRead;
  ppVar11 = local_168;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    ppVar11->_lat = (double)pfVar9->fds_bits[0];
    pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar13 * -2 + 1) * 8);
    ppVar11 = (positionTy *)((long)ppVar11 + (ulong)bVar13 * -0x10 + 8);
  }
  pfVar9 = &sRead;
  ppVar11 = &currPos;
  for (; lVar8 != 0; lVar8 = lVar8 + -1) {
    ppVar11->_lat = (double)pfVar9->fds_bits[0];
    pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar13 * -2 + 1) * 8);
    ppVar11 = (positionTy *)((long)ppVar11 + (ulong)bVar13 * -0x10 + 8);
  }
  bVar2 = APRSDoLogin(this);
  if (!bVar2) {
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[7])
              (this,0,1);
  }
  local_170 = &this->aprsLastKeepAlive;
  while( true ) {
    iVar12 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
               _vptr_LTChannel[4])(this);
    if ((((byte)iVar12 & (this->tcpAprs).super_SocketNetworking.f_socket != -1) != 1) ||
       (dVar1 = CoordDistance(local_168,&currPos),
       (double)((iVar4 * 0x73c) / 1000) * 0.2 <= dVar1 / 1000.0)) break;
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      sRead.fds_bits[lVar8] = 0;
    }
    iVar12 = (this->tcpAprs).super_SocketNetworking.f_socket;
    sRead.fds_bits[iVar12 / 0x40] = sRead.fds_bits[iVar12 / 0x40] | 1L << ((byte)iVar12 & 0x3f);
    sRead.fds_bits[this->aprsPipe[0] / 0x40] =
         sRead.fds_bits[this->aprsPipe[0] / 0x40] | 1L << ((byte)this->aprsPipe[0] & 0x3f);
    timeout.tv_sec = 0x3c;
    timeout.tv_usec = 0;
    __n = 0;
    __timeout = (timeval *)&timeout;
    iVar12 = select(iVar3,(fd_set *)&sRead,(fd_set *)0x0,(fd_set *)0x0,__timeout);
    __flags = (int)__timeout;
    iVar4 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[4])(this);
    if ((char)iVar4 == '\0') break;
    if (iVar12 == 0) {
      pNVar6 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_150,"\'select\' ran into a timeout",&local_179);
      XPMP2::NetRuntimeError::NetRuntimeError(pNVar6,local_150);
      __cxa_throw(pNVar6,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError)
      ;
    }
    if (iVar12 == -1) {
      pNVar6 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_150,"\'select\' failed",&local_179);
      XPMP2::NetRuntimeError::NetRuntimeError(pNVar6,local_150);
      __cxa_throw(pNVar6,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError)
      ;
    }
    if ((0 < iVar12) &&
       (iVar12 = (this->tcpAprs).super_SocketNetworking.f_socket,
       ((ulong)sRead.fds_bits[iVar12 / 0x40] >> ((long)iVar12 % 0x40 & 0x3fU) & 1) != 0)) {
      sVar5 = XPMP2::SocketNetworking::recv
                        (&local_178->super_SocketNetworking,0,(void *)0x0,__n,__flags);
      if (sVar5 < 1) {
        pNVar6 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_150,"Read no data from TCP socket ",&local_179);
        XPMP2::NetRuntimeError::NetRuntimeError(pNVar6,local_150);
        __cxa_throw(pNVar6,&XPMP2::NetRuntimeError::typeinfo,
                    XPMP2::NetRuntimeError::~NetRuntimeError);
      }
      buffer = (this->tcpAprs).super_SocketNetworking.buf;
      if (buffer == (char *)0x0) {
        buffer = "";
      }
      bVar2 = APRSProcessData(this,buffer);
      if (!bVar2) {
        pNVar6 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_150,"APRSProcessData failed",&local_179);
        XPMP2::NetRuntimeError::NetRuntimeError(pNVar6,local_150);
        __cxa_throw(pNVar6,&XPMP2::NetRuntimeError::typeinfo,
                    XPMP2::NetRuntimeError::~NetRuntimeError);
      }
    }
    bVar2 = CheckEverySoOften(local_170,600.0);
    if (bVar2) {
      APRSSendKeepAlive(this);
    }
    iVar4 = dataRefs.fdStdDistance;
    DataRefs::GetViewPos();
    psVar10 = local_150;
    ppVar11 = &currPos;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      ppVar11->_lat = (double)(psVar10->_M_dataplus)._M_p;
      psVar10 = (string *)((long)psVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      ppVar11 = (positionTy *)((long)ppVar11 + (ulong)bVar13 * -0x10 + 8);
    }
  }
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 4) {
    iVar12 = *(int *)((long)this->aprsPipe + lVar8);
    if (iVar12 != -1) {
      close(iVar12);
    }
    *(undefined4 *)((long)this->aprsPipe + lVar8) = 0xffffffff;
  }
  XPMP2::TCPConnection::Close(local_178);
  this->aprsLastData = NAN;
  ThreadSettings::~ThreadSettings(&TS);
  return;
}

Assistant:

void OpenGliderConnection::APRSMain ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_OGN_APRS", LC_ALL_MASK);
    
    try {
        // clear data
        aprsData.clear();
        aprsLastData = NAN;
        aprsLastKeepAlive = 0;
        // open a TCP connection to APRS.glidernet.org
        tcpAprs.Connect(OGN_APRS_SERVER, OGN_APRS_PORT, OGN_APRS_BUF_SIZE, unsigned(OGN_APRS_TIMEOUT_S * 1000));
        int maxSock = (int)tcpAprs.getSocket() + 1;
#if APL == 1 || LIN == 1
        // the self-pipe to shut down the TCP socket gracefully
        if (pipe(aprsPipe) < 0)
            throw XPMP2::NetRuntimeError("Couldn't create pipe");
        fcntl(aprsPipe[0], F_SETFL, O_NONBLOCK);
        maxSock = std::max(maxSock, aprsPipe[0]+1);
#endif
        
        // Login
        double dist_km = dataRefs.GetFdStdDistance_km();
        positionTy currPos = aprsPos = dataRefs.GetViewPos();
        if (!APRSDoLogin()) {
            SetValid(false, true);
        }
        
        // *** Main Loop ***
        while (shallRun() && tcpAprs.isOpen() &&
               // test for camera position not too far away from login's position
               aprsPos.dist(currPos) / M_per_KM < 0.2 * dist_km)
        {
            // wait for some signal on either socket (APRS or self-pipe)
            fd_set sRead;
            FD_ZERO(&sRead);
            FD_SET(tcpAprs.getSocket(), &sRead);     // check our socket
#if APL == 1 || LIN == 1
            FD_SET(aprsPipe[0], &sRead);              // check the self-pipe
#endif
            struct timeval timeout = { OGN_APRS_TIMEOUT_S, 0 };
            int retval = select(maxSock, &sRead, NULL, NULL, &timeout);
            
            // short-cut if we are to shut down (return from 'select' due to closed socket)
            if (!shallRun())
                break;

            // select call failed???
            if (retval == -1)
                throw XPMP2::NetRuntimeError("'select' failed");
            else if (retval == 0)
                throw XPMP2::NetRuntimeError("'select' ran into a timeout");

            // select successful - traffic data
            if (retval > 0 && FD_ISSET(tcpAprs.getSocket(), &sRead))
            {
                // read APRS message
                long rcvdBytes = tcpAprs.recv();
                
                // received something?
                if (rcvdBytes > 0)
                {
                    // have it processed
                    if (!APRSProcessData(tcpAprs.getBuf()))
                        throw XPMP2::NetRuntimeError("APRSProcessData failed");
                }
                else
                    throw XPMP2::NetRuntimeError("Read no data from TCP socket ");
            }

            // Send a keep-alive every 15 minutes
            if (CheckEverySoOften(aprsLastKeepAlive, OGN_APRS_SEND_KEEPALV))
                APRSSendKeepAlive();
            
            // Update position information for test of distance to camera
            dist_km = dataRefs.GetFdStdDistance_km();
            currPos = dataRefs.GetViewPos();
        }
    }
    catch (std::runtime_error& e) {
        LOG_MSG(logERR, ERR_TCP_LISTENACCEPT, ChName(),
                OGN_APRS_SERVER, std::to_string(OGN_APRS_PORT).c_str(),
                e.what());
        // Stop this connection attempt
        if (GetErrCnt() == CH_MAC_ERR_CNT) {         // too bad already?
            bFailoverToHttp = true; // we fail over to the HTTP way of things
            SetValid(true);         // this resets the error count
        } else
            IncErrCnt();
    }
    
#if APL == 1 || LIN == 1
    // close the self-pipe sockets
    for (SOCKET &s: aprsPipe) {
        if (s != INVALID_SOCKET) close(s);
        s = INVALID_SOCKET;
    }
#endif
    
    // make sure the socket is closed
    tcpAprs.Close();
    aprsLastData = NAN;
}